

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O0

void __thiscall
Js::StringProfiler::RecordConcatenation
          (StringProfiler *this,uint lenLeft,uint lenRight,ConcatType type)

{
  bool bVar1;
  ConcatType *pCVar2;
  uint *puVar3;
  ConcatMetrics local_40;
  ConcatMetrics *local_30;
  ConcatMetrics *metrics;
  uint local_20;
  UintUintPair key;
  ConcatType type_local;
  uint lenRight_local;
  uint lenLeft_local;
  StringProfiler *this_local;
  
  key.first = type;
  key.second = lenRight;
  type_local = lenLeft;
  _lenRight_local = this;
  bVar1 = IsOnWrongThread(this);
  if (!bVar1) {
    pCVar2 = min<unsigned_int>(&type_local,&k_MaxConcatLength);
    type_local = *pCVar2;
    puVar3 = min<unsigned_int>(&key.second,&k_MaxConcatLength);
    local_20 = *puVar3;
    metrics._4_4_ = type_local;
    key.second = local_20;
    bVar1 = JsUtil::
            BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<Js::StringProfiler::UintUintPair>
                      (&this->stringConcatMetrics,(UintUintPair *)((long)&metrics + 4),&local_30);
    if (bVar1) {
      ConcatMetrics::Accumulate(local_30,key.first);
    }
    else {
      ConcatMetrics::ConcatMetrics(&local_40,key.first);
      JsUtil::
      BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(&this->stringConcatMetrics,(UintUintPair *)((long)&metrics + 4),&local_40);
    }
  }
  return;
}

Assistant:

void StringProfiler::RecordConcatenation( uint lenLeft, uint lenRight, ConcatType type )
    {
        if( IsOnWrongThread() )
        {
            return;
        }

        lenLeft = min( lenLeft, k_MaxConcatLength );
        lenRight = min( lenRight, k_MaxConcatLength );

        UintUintPair key = { lenLeft, lenRight };
        ConcatMetrics* metrics;
        if(!stringConcatMetrics.TryGetReference(key, &metrics))
        {
            stringConcatMetrics.Add(key, ConcatMetrics(type));
        }
        else
        {
            metrics->Accumulate(type);
        }
    }